

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::find_position<int>
          (dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
           *this,int *key)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  
  uVar4 = this->num_buckets - 1;
  uVar3 = uVar4 & (long)*key;
  iVar1 = (this->key_info).empty_key;
  iVar6 = this->table[uVar3];
  uVar2 = 0xffffffffffffffff;
  if (iVar1 == iVar6) {
    uVar7 = 0xffffffffffffffff;
  }
  else {
    uVar7 = 0xffffffffffffffff;
    lVar5 = 1;
    do {
      if ((this->num_deleted == 0) || ((this->key_info).delkey != iVar6)) {
        if (*key == iVar6) {
          uVar2 = uVar3;
          uVar3 = 0xffffffffffffffff;
          goto LAB_00600372;
        }
      }
      else if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar3;
      }
      uVar3 = uVar3 + lVar5 & uVar4;
      iVar6 = this->table[uVar3];
      lVar5 = lVar5 + 1;
    } while (iVar1 != iVar6);
  }
  if (uVar7 != 0xffffffffffffffff) {
    uVar3 = uVar7;
  }
LAB_00600372:
  pVar8.second = uVar3;
  pVar8.first = uVar2;
  return pVar8;
}

Assistant:

size_type bucket_count() const { return num_buckets; }